

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  stbi__uint16 *__ptr;
  stbi__uint16 *image;
  ulong uVar5;
  int iVar6;
  ushort uVar7;
  uint uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    image = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel == 8) {
      iVar6 = req_comp;
      if (req_comp == 0) {
        iVar6 = *comp;
      }
      iVar6 = *y * *x * iVar6;
      image = (stbi__uint16 *)malloc((long)(iVar6 * 2));
      if (image == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
      }
      else {
        if (0 < iVar6) {
          auVar9 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar10 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar13 = vmovdqa64_avx512f(_DAT_001c6380);
          auVar14 = vpbroadcastq_avx512f();
          uVar5 = 0;
          do {
            auVar15 = vpbroadcastq_avx512f();
            auVar16 = vporq_avx512f(auVar15,auVar9);
            auVar17 = vporq_avx512f(auVar15,auVar11);
            auVar18 = vporq_avx512f(auVar15,auVar10);
            auVar15 = vporq_avx512f(auVar15,auVar12);
            uVar1 = vpcmpuq_avx512f(auVar15,auVar14,2);
            uVar2 = vpcmpuq_avx512f(auVar17,auVar14,2);
            uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
            bVar4 = (byte)uVar3;
            uVar3 = vpcmpuq_avx512f(auVar18,auVar14,2);
            uVar7 = CONCAT11(bVar4,(byte)uVar3);
            uVar8 = CONCAT22(uVar7,CONCAT11((byte)uVar2,(byte)uVar1));
            auVar15._0_32_ = vmovdqu8_avx512vl(*(undefined1 (*) [32])((long)__ptr + uVar5));
            auVar16[1] = ((byte)(uVar8 >> 1) & 1) * auVar15[1];
            auVar16[0] = ((byte)uVar1 & 1) * auVar15[0];
            auVar16[2] = ((byte)(uVar8 >> 2) & 1) * auVar15[2];
            auVar16[3] = ((byte)(uVar8 >> 3) & 1) * auVar15[3];
            auVar16[4] = ((byte)(uVar8 >> 4) & 1) * auVar15[4];
            auVar16[5] = ((byte)(uVar8 >> 5) & 1) * auVar15[5];
            auVar16[6] = ((byte)(uVar8 >> 6) & 1) * auVar15[6];
            auVar16[7] = ((byte)(uVar8 >> 7) & 1) * auVar15[7];
            auVar16[8] = ((byte)uVar2 & 1) * auVar15[8];
            auVar16[9] = ((byte)(uVar8 >> 9) & 1) * auVar15[9];
            auVar16[10] = ((byte)(uVar8 >> 10) & 1) * auVar15[10];
            auVar16[0xb] = ((byte)(uVar8 >> 0xb) & 1) * auVar15[0xb];
            auVar16[0xc] = ((byte)(uVar8 >> 0xc) & 1) * auVar15[0xc];
            auVar16[0xd] = ((byte)(uVar8 >> 0xd) & 1) * auVar15[0xd];
            auVar16[0xe] = ((byte)(uVar8 >> 0xe) & 1) * auVar15[0xe];
            auVar16[0xf] = ((byte)(uVar8 >> 0xf) & 1) * auVar15[0xf];
            auVar16[0x10] = ((byte)uVar3 & 1) * auVar15[0x10];
            auVar16[0x11] = ((byte)(uVar7 >> 1) & 1) * auVar15[0x11];
            auVar16[0x12] = ((byte)(uVar7 >> 2) & 1) * auVar15[0x12];
            auVar16[0x13] = ((byte)(uVar7 >> 3) & 1) * auVar15[0x13];
            auVar16[0x14] = ((byte)(uVar7 >> 4) & 1) * auVar15[0x14];
            auVar16[0x15] = ((byte)(uVar7 >> 5) & 1) * auVar15[0x15];
            auVar16[0x16] = ((byte)(uVar7 >> 6) & 1) * auVar15[0x16];
            auVar16[0x17] = ((byte)(uVar7 >> 7) & 1) * auVar15[0x17];
            auVar16[0x18] = (bVar4 & 1) * auVar15[0x18];
            auVar16[0x19] = (bVar4 >> 1 & 1) * auVar15[0x19];
            auVar16[0x1a] = (bVar4 >> 2 & 1) * auVar15[0x1a];
            auVar16[0x1b] = (bVar4 >> 3 & 1) * auVar15[0x1b];
            auVar16[0x1c] = (bVar4 >> 4 & 1) * auVar15[0x1c];
            auVar16._30_34_ = auVar15._30_34_;
            auVar16[0x1d] = (bVar4 >> 5 & 1) * auVar15[0x1d];
            auVar15 = vpermb_avx512_vbmi(auVar13,ZEXT3264(auVar16._0_32_));
            auVar15 = vmovdqu16_avx512bw(auVar15);
            *(undefined1 (*) [64])(image + uVar5) = auVar15;
            uVar5 = uVar5 + 0x20;
          } while ((iVar6 + 0x1fU & 0xffffffe0) != uVar5);
        }
        free(__ptr);
      }
    }
    else {
      image = __ptr;
      if (local_3c.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                      ,0x481,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp * 2);
    }
  }
  return image;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 16) {
      STBI_ASSERT(ri.bits_per_channel == 8);
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}